

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void legendre_function_q_values(int *n_data,int *n,double *x,double *fx)

{
  double local_118;
  double x_vec [12];
  int n_vec [12];
  double fx_vec [12];
  double *fx_local;
  double *x_local;
  int *n_local;
  int *n_data_local;
  
  memcpy(n_vec + 10,&DAT_00264fe0,0x60);
  memcpy(x_vec + 0xb,&DAT_00265040,0x30);
  memset(&local_118,0,0x60);
  x_vec[5] = 0.5;
  x_vec[6] = 0.5;
  x_vec[7] = 0.5;
  x_vec[8] = 0.5;
  x_vec[9] = 0.5;
  x_vec[10] = 0.5;
  if (*n_data < 0) {
    *n_data = 0;
  }
  if (*n_data < 0xc) {
    *n = n_vec[(long)*n_data + -2];
    *x = x_vec[(long)*n_data + -1];
    *fx = fx_vec[(long)*n_data + -1];
    *n_data = *n_data + 1;
  }
  else {
    *n_data = 0;
    *n = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  return;
}

Assistant:

void legendre_function_q_values ( int *n_data, int *n, double *x, double *fx )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_FUNCTION_Q_VALUES returns values of the Legendre Q function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to 1.  On each subsequent call, the input value of N_DATA is
//    incremented and that test data item is returned, if available.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, the order of the function.
//
//    Output, double *X, the point where the function is evaluated.
//
//    Output, double *FX, the value of the function.
//
{
# define N_MAX 12

  double fx_vec[N_MAX] = {
     0.00000000, -1.00000000,  0.00000000, 
     0.66666667, -0.40634921,  0.00000000, 
     0.54930614, -0.72534693, -0.81866327, 
    -0.19865477, -0.11616303,  0.29165814 };
  int n_vec[N_MAX] = {
     0,  1,  2, 
     3,  9, 10, 
     0,  1,  2, 
     3,  9, 10 };
  double x_vec[N_MAX] = {
    0.0,  0.0,  0.0, 
    0.0,  0.0,  0.0, 
    0.5,  0.5,  0.5, 
    0.5,  0.5,  0.5  };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  else
  {
    *n = n_vec[*n_data];
    *x = x_vec[*n_data];
    *fx = fx_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}